

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_4757d::FunctionRegistrator::FunctionRegistrator(FunctionRegistrator *this)

{
  ImageTypeManager *pIVar1;
  FunctionTableHolder *in_RDI;
  ImageTemplate<unsigned_char> *this_00;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined1 in_stack_ffffffffffffffcf;
  FunctionTableHolder *in_stack_ffffffffffffffd0;
  uint8_t in_stack_ffffffffffffffdf;
  ImageTypeManager *in_stack_ffffffffffffffe0;
  
  Image_Function_Helper::FunctionTableHolder::FunctionTableHolder(in_RDI);
  in_RDI->AbsoluteDifference = Image_Function_Simd::AbsoluteDifference;
  in_RDI->Accumulate = Image_Function_Simd::Accumulate;
  in_RDI->BitwiseAnd = Image_Function_Simd::BitwiseAnd;
  in_RDI->BitwiseOr = Image_Function_Simd::BitwiseOr;
  in_RDI->BitwiseXor = Image_Function_Simd::BitwiseXor;
  in_RDI->ConvertToRgb = Image_Function_Simd::ConvertToRgb;
  in_RDI->Flip = Image_Function_Simd::Flip;
  in_RDI->Invert = Image_Function_Simd::Invert;
  in_RDI->Maximum = Image_Function_Simd::Maximum;
  in_RDI->Minimum = Image_Function_Simd::Minimum;
  in_RDI->ProjectionProfile = Image_Function_Simd::ProjectionProfile;
  in_RDI->RgbToBgr = Image_Function_Simd::RgbToBgr;
  in_RDI->Subtract = Image_Function_Simd::Subtract;
  in_RDI->Sum = Image_Function_Simd::Sum;
  in_RDI->Threshold = Image_Function_Simd::Threshold;
  in_RDI->Threshold2 = Image_Function_Simd::Threshold;
  pIVar1 = ImageTypeManager::instance();
  this_00 = (ImageTemplate<unsigned_char> *)&stack0xffffffffffffffd0;
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (uint32_t)((ulong)this_00 >> 0x20),(uint32_t)this_00,(uint8_t)((ulong)pIVar1 >> 0x38),
             (uint8_t)((ulong)pIVar1 >> 0x30));
  PenguinV_Image::ImageTemplate<unsigned_char>::type(this_00);
  ImageTypeManager::setFunctionTable
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf,in_stack_ffffffffffffffd0,
             (bool)in_stack_ffffffffffffffcf);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x12b9de);
  return;
}

Assistant:

FunctionRegistrator()
        {
            table.AbsoluteDifference = &Image_Function::AbsoluteDifference;
            table.Accumulate         = &Image_Function::Accumulate;
            table.BitwiseAnd         = &Image_Function::BitwiseAnd;
            table.BitwiseOr          = &Image_Function::BitwiseOr;
            table.BitwiseXor         = &Image_Function::BitwiseXor;
            table.ConvertToGrayScale = &Image_Function::ConvertToGrayScale;
            table.ConvertToRgb       = &Image_Function::ConvertToRgb;
            table.Copy               = &Image_Function::Copy;
            table.ExtractChannel     = &Image_Function::ExtractChannel;
            table.Fill               = &Image_Function::Fill;
            table.Flip               = &Image_Function::Flip;
            table.GammaCorrection    = &Image_Function::GammaCorrection;
            table.GetPixel           = &Image_Function::GetPixel;
            table.Histogram          = &Image_Function::Histogram;
            table.Invert             = &Image_Function::Invert;
            table.IsEqual            = &Image_Function::IsEqual;
            table.LookupTable        = &Image_Function::LookupTable;
            table.Maximum            = &Image_Function::Maximum;
            table.Merge              = &Image_Function::Merge;
            table.Minimum            = &Image_Function::Minimum;
            table.Normalize          = &Image_Function::Normalize;
            table.ProjectionProfile  = &Image_Function::ProjectionProfile;
            table.Resize             = &Image_Function::Resize;
            table.RgbToBgr           = &Image_Function::RgbToBgr;
            table.SetPixel           = &Image_Function::SetPixel;
            table.SetPixel2          = &Image_Function::SetPixel;
            table.Shift              = &Image_Function::Shift;
            table.Split              = &Image_Function::Split;
            table.Subtract           = &Image_Function::Subtract;
            table.Sum                = &Image_Function::Sum;
            table.Threshold          = &Image_Function::Threshold;
            table.Threshold2         = &Image_Function::Threshold;
            table.Transpose          = &Image_Function::Transpose;

            ImageTypeManager::instance().setFunctionTable( PenguinV_Image::Image().type(), table );
        }